

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_removeVariableMethods_Test::TestBody(Variable_removeVariableMethods_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  element_type *peVar6;
  AssertionResult local_510 [2];
  AssertHelper local_4f0 [8];
  Message local_4e8 [15];
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__6;
  Message local_4c0 [8];
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_2;
  AssertionResult local_488 [2];
  AssertHelper local_468 [8];
  Message local_460 [15];
  bool local_451;
  undefined1 local_450 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_420 [8];
  Message local_418 [15];
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3d8 [8];
  Message local_3d0 [15];
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__3;
  Message local_3a8 [8];
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_1;
  AssertionResult local_370 [2];
  AssertHelper local_350 [8];
  Message local_348 [15];
  allocator<char> local_339;
  string local_338 [39];
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__2;
  Message local_2f8 [8];
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar;
  string a;
  PrinterPtr printer;
  AssertHelper local_290 [8];
  Message local_288 [15];
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_248 [8];
  Message local_240 [15];
  allocator<char> local_231;
  string local_230 [39];
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  undefined1 local_158 [8];
  VariablePtr v5;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr c;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  ModelPtr m;
  undefined1 local_90 [8];
  string e2;
  undefined1 local_68 [8];
  string e1;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Variable_removeVariableMethods_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"valid_name",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"valid_name\">\n    <variable name=\"variable2\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)(e2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(e2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"valid_name\"/>\n</model>\n"
             ,(allocator<char> *)
              ((long)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"",
             (allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  createModelWithComponent((string *)local_a8,local_c8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_a8);
  libcellml::ComponentEntity::component
            ((ulong)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::NamedEntity::setName((string *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"variable1",&local_179);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"variable2",&local_1a1);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"variable3",&local_1c9);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"variable4",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"variable1",&local_231);
  bVar1 = libcellml::Component::removeVariable((string *)peVar3);
  local_209 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar2) {
    testing::Message::Message(local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_208,"c->removeVariable(\"variable1\")"
               ,"false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2ce,pcVar5);
    testing::internal::AssertHelper::operator=(local_248,local_240);
    testing::internal::AssertHelper::~AssertHelper(local_248);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::removeVariable((shared_ptr *)peVar3);
  local_279 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar2) {
    testing::Message::Message(local_288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_278,"c->removeVariable(v3)","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2cf,pcVar5);
    testing::internal::AssertHelper::operator=(local_290,local_288);
    testing::internal::AssertHelper::~AssertHelper(local_290);
    std::__cxx11::string::~string
              ((string *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  libcellml::Printer::create();
  peVar6 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar.message_,SUB81(peVar6,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_2f0,"e1","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(local_2f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"BAD_NAME",&local_339);
  bVar1 = libcellml::Component::removeVariable((string *)peVar3);
  local_311 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_310,&local_311,(type *)0x0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar2) {
    testing::Message::Message(local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_370,local_310,"c->removeVariable(\"BAD_NAME\")","true");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d3,pcVar5);
    testing::internal::AssertHelper::operator=(local_350,local_348);
    testing::internal::AssertHelper::~AssertHelper(local_350);
    std::__cxx11::string::~string((string *)local_370);
    testing::Message::~Message(local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Component::removeAllVariables();
  peVar6 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_1.message_,SUB81(peVar6,0));
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_3a0,"e2","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar2) {
    testing::Message::Message(local_3a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::removeVariable((shared_ptr *)peVar3);
  local_3c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__4.message_,local_3c0,"c->removeVariable(v5)","true");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2d9,pcVar5);
    testing::internal::AssertHelper::operator=(local_3d8,local_3d0);
    testing::internal::AssertHelper::~AssertHelper(local_3d8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::removeVariable((ulong)peVar3);
  local_409 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_408,&local_409,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar2) {
    testing::Message::Message(local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__5.message_,local_408,"c->removeVariable(0)","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2df,pcVar5);
    testing::internal::AssertHelper::operator=(local_420,local_418);
    testing::internal::AssertHelper::~AssertHelper(local_420);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::removeVariable((ulong)peVar3);
  local_451 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_450,&local_451,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar2) {
    testing::Message::Message(local_460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_488,local_450,"c->removeVariable(1)","false");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2e0,pcVar5);
    testing::internal::AssertHelper::operator=(local_468,local_460);
    testing::internal::AssertHelper::~AssertHelper(local_468);
    std::__cxx11::string::~string((string *)local_488);
    testing::Message::~Message(local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  peVar6 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_2.message_,SUB81(peVar6,0));
  std::__cxx11::string::operator=((string *)&gtest_ar.message_,(string *)&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_4b8,"e1","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    testing::Message::Message(local_4c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2e2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__6.message_,local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    testing::Message::~Message(local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::Component::removeVariable((ulong)peVar3);
  local_4d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar2) {
    testing::Message::Message(local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_510,local_4d8,"c->removeVariable(1)","true");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x2e3,pcVar5);
    testing::internal::AssertHelper::operator=(local_4f0,local_4e8);
    testing::internal::AssertHelper::~AssertHelper(local_4f0);
    std::__cxx11::string::~string((string *)local_510);
    testing::Message::~Message(local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_158);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_a8);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Variable, removeVariableMethods)
{
    const std::string in = "valid_name";
    const std::string e1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"valid_name\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "</model>\n";
    const std::string e2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"valid_name\"/>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    libcellml::VariablePtr v5 = libcellml::Variable::create();

    c->setName(in);
    v1->setName("variable1");
    v2->setName("variable2");
    v3->setName("variable3");
    v4->setName("variable4");

    c->addVariable(v1);
    c->addVariable(v2);
    c->addVariable(v3);

    EXPECT_TRUE(c->removeVariable("variable1"));
    EXPECT_TRUE(c->removeVariable(v3));
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e1, a);
    EXPECT_FALSE(c->removeVariable("BAD_NAME"));

    c->addVariable(v4);
    c->removeAllVariables();
    a = printer->printModel(m);
    EXPECT_EQ(e2, a);
    EXPECT_FALSE(c->removeVariable(v5));

    c->addVariable(v1);
    c->addVariable(v2);
    c->addVariable(v3);

    EXPECT_TRUE(c->removeVariable(0)); // v1
    EXPECT_TRUE(c->removeVariable(1)); // new index of v3
    a = printer->printModel(m);
    EXPECT_EQ(e1, a);
    EXPECT_FALSE(c->removeVariable(1));
}